

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,ScalarFunctionSet *set)

{
  CreateScalarFunctionInfo info;
  FunctionSet<duckdb::ScalarFunction> local_200;
  CreateScalarFunctionInfo local_1c8;
  
  FunctionSet<duckdb::ScalarFunction>::FunctionSet
            (&local_200,&set->super_FunctionSet<duckdb::ScalarFunction>);
  CreateScalarFunctionInfo::CreateScalarFunctionInfo(&local_1c8,(ScalarFunctionSet *)&local_200);
  FunctionSet<duckdb::ScalarFunction>::~FunctionSet(&local_200);
  local_1c8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1c8.super_CreateFunctionInfo);
  CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&local_1c8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(ScalarFunctionSet set) {
	CreateScalarFunctionInfo info(std::move(set));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}